

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O3

int ConnectPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  timespec req;
  char line [256];
  timespec local_208;
  byte local_1f8;
  char local_1f7;
  int *local_f8;
  BOOL *local_f0;
  int *local_e8;
  BOOL *local_e0;
  int *local_d8;
  int *local_d0;
  BOOL *local_c8;
  int *local_c0;
  BOOL *local_b8;
  double *local_b0;
  BOOL *local_a8;
  double *local_a0;
  double *local_98;
  BOOL *local_90;
  BOOL *local_88;
  int *local_80;
  BOOL *local_78;
  BOOL *local_70;
  BOOL *local_68;
  BOOL *local_60;
  BOOL *local_58;
  BOOL *local_50;
  BOOL *local_48;
  BOOL *local_40;
  BOOL *local_38;
  
  memset(pPathfinderDVL->szCfgFilePath,0,0x100);
  sprintf(pPathfinderDVL->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_1f8,0,0x100);
    memset(pPathfinderDVL->szDevPath + 5,0,0xfb);
    builtin_strncpy(pPathfinderDVL->szDevPath,"COM1",5);
    pPathfinderDVL->BaudRate = 0x1c200;
    pPathfinderDVL->timeout = 0x5dc;
    pPathfinderDVL->threadperiod = 100;
    pPathfinderDVL->bSaveRawData = 1;
    pPathfinderDVL->StartupDelay = 4000;
    pPathfinderDVL->bSendBreak = 1;
    pPathfinderDVL->BreakMode = 1;
    pPathfinderDVL->BreakDuration = 300;
    pPathfinderDVL->bRetrieveParameters = 1;
    pPathfinderDVL->Parameters = 1;
    pPathfinderDVL->bSetHeadingAlignment = 1;
    pPathfinderDVL->HeadingAlignment = 45.0;
    pPathfinderDVL->bSetRollPitchMisalignment = 0;
    pPathfinderDVL->RollMisalignment = 0.0;
    pPathfinderDVL->PitchMisalignment = 0.0;
    pPathfinderDVL->bUpOrientation = 0;
    pPathfinderDVL->bSelectDataStream = 1;
    pPathfinderDVL->DataStream = 6;
    pPathfinderDVL->bEnableAutoPing = 0;
    pPathfinderDVL->bKeepAsUserDefaults = 1;
    pPathfinderDVL->bStartPinging = 1;
    pPathfinderDVL->bEnable_PD6_SA = 0;
    pPathfinderDVL->bEnable_PD6_TS = 0;
    pPathfinderDVL->bEnable_PD6_BI = 0;
    pPathfinderDVL->bEnable_PD6_BS = 1;
    pPathfinderDVL->bEnable_PD6_BE = 0;
    pPathfinderDVL->bEnable_PD6_BD = 0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      local_f8 = &pPathfinderDVL->threadperiod;
      local_f0 = &pPathfinderDVL->bSaveRawData;
      local_e8 = &pPathfinderDVL->StartupDelay;
      local_e0 = &pPathfinderDVL->bSendBreak;
      local_d8 = &pPathfinderDVL->BreakMode;
      local_d0 = &pPathfinderDVL->BreakDuration;
      local_c8 = &pPathfinderDVL->bRetrieveParameters;
      local_c0 = &pPathfinderDVL->Parameters;
      local_b8 = &pPathfinderDVL->bSetHeadingAlignment;
      local_b0 = &pPathfinderDVL->HeadingAlignment;
      local_a8 = &pPathfinderDVL->bSetRollPitchMisalignment;
      local_a0 = &pPathfinderDVL->RollMisalignment;
      local_98 = &pPathfinderDVL->PitchMisalignment;
      local_90 = &pPathfinderDVL->bUpOrientation;
      local_88 = &pPathfinderDVL->bSelectDataStream;
      local_80 = &pPathfinderDVL->DataStream;
      local_78 = &pPathfinderDVL->bEnableAutoPing;
      local_70 = &pPathfinderDVL->bKeepAsUserDefaults;
      local_68 = &pPathfinderDVL->bStartPinging;
      local_60 = &pPathfinderDVL->bEnable_PD6_SA;
      local_58 = &pPathfinderDVL->bEnable_PD6_TS;
      local_50 = &pPathfinderDVL->bEnable_PD6_BI;
      local_48 = &pPathfinderDVL->bEnable_PD6_BS;
      local_40 = &pPathfinderDVL->bEnable_PD6_BE;
      local_38 = &pPathfinderDVL->bEnable_PD6_BD;
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae1d5;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae1ed;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae1d5:
        if (pcVar2 == (char *)0x0) goto LAB_001ae1f2;
      }
      if (local_1f8 == 0x24) goto LAB_001ae1f2;
LAB_001ae1ed:
      if (pcVar2 == (char *)0x0) {
LAB_001ae1f2:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%255s",pPathfinderDVL->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae261;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae26d;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae261:
        if (pcVar2 == (char *)0x0) goto LAB_001ae272;
      }
      if (local_1f8 == 0x24) goto LAB_001ae272;
LAB_001ae26d:
      if (pcVar2 == (char *)0x0) {
LAB_001ae272:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",&pPathfinderDVL->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae2e1;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae2ed;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae2e1:
        if (pcVar2 == (char *)0x0) goto LAB_001ae2f2;
      }
      if (local_1f8 == 0x24) goto LAB_001ae2f2;
LAB_001ae2ed:
      if (pcVar2 == (char *)0x0) {
LAB_001ae2f2:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",&pPathfinderDVL->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae361;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae36d;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae361:
        if (pcVar2 == (char *)0x0) goto LAB_001ae372;
      }
      if (local_1f8 == 0x24) goto LAB_001ae372;
LAB_001ae36d:
      if (pcVar2 == (char *)0x0) {
LAB_001ae372:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_f8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae3e6;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae3f2;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae3e6:
        if (pcVar2 == (char *)0x0) goto LAB_001ae3f7;
      }
      if (local_1f8 == 0x24) goto LAB_001ae3f7;
LAB_001ae3f2:
      if (pcVar2 == (char *)0x0) {
LAB_001ae3f7:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_f0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae46b;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae477;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae46b:
        if (pcVar2 == (char *)0x0) goto LAB_001ae47c;
      }
      if (local_1f8 == 0x24) goto LAB_001ae47c;
LAB_001ae477:
      if (pcVar2 == (char *)0x0) {
LAB_001ae47c:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_e8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae4f0;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae4fc;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae4f0:
        if (pcVar2 == (char *)0x0) goto LAB_001ae501;
      }
      if (local_1f8 == 0x24) goto LAB_001ae501;
LAB_001ae4fc:
      if (pcVar2 == (char *)0x0) {
LAB_001ae501:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_e0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae575;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae581;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae575:
        if (pcVar2 == (char *)0x0) goto LAB_001ae586;
      }
      if (local_1f8 == 0x24) goto LAB_001ae586;
LAB_001ae581:
      if (pcVar2 == (char *)0x0) {
LAB_001ae586:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_d8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae5fa;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae606;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae5fa:
        if (pcVar2 == (char *)0x0) goto LAB_001ae60b;
      }
      if (local_1f8 == 0x24) goto LAB_001ae60b;
LAB_001ae606:
      if (pcVar2 == (char *)0x0) {
LAB_001ae60b:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_d0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae67f;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae68b;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae67f:
        if (pcVar2 == (char *)0x0) goto LAB_001ae690;
      }
      if (local_1f8 == 0x24) goto LAB_001ae690;
LAB_001ae68b:
      if (pcVar2 == (char *)0x0) {
LAB_001ae690:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_c8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae704;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae710;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae704:
        if (pcVar2 == (char *)0x0) goto LAB_001ae715;
      }
      if (local_1f8 == 0x24) goto LAB_001ae715;
LAB_001ae710:
      if (pcVar2 == (char *)0x0) {
LAB_001ae715:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_c0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae789;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae795;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae789:
        if (pcVar2 == (char *)0x0) goto LAB_001ae79a;
      }
      if (local_1f8 == 0x24) goto LAB_001ae79a;
LAB_001ae795:
      if (pcVar2 == (char *)0x0) {
LAB_001ae79a:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_b8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae80e;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae81a;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae80e:
        if (pcVar2 == (char *)0x0) goto LAB_001ae81f;
      }
      if (local_1f8 == 0x24) goto LAB_001ae81f;
LAB_001ae81a:
      if (pcVar2 == (char *)0x0) {
LAB_001ae81f:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%lf",local_b0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae893;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae89f;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae893:
        if (pcVar2 == (char *)0x0) goto LAB_001ae8a4;
      }
      if (local_1f8 == 0x24) goto LAB_001ae8a4;
LAB_001ae89f:
      if (pcVar2 == (char *)0x0) {
LAB_001ae8a4:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_a8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae918;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae924;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae918:
        if (pcVar2 == (char *)0x0) goto LAB_001ae929;
      }
      if (local_1f8 == 0x24) goto LAB_001ae929;
LAB_001ae924:
      if (pcVar2 == (char *)0x0) {
LAB_001ae929:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%lf",local_a0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001ae99d;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001ae9a9;
        }
        if (local_1f8 != 0x23) break;
LAB_001ae99d:
        if (pcVar2 == (char *)0x0) goto LAB_001ae9ae;
      }
      if (local_1f8 == 0x24) goto LAB_001ae9ae;
LAB_001ae9a9:
      if (pcVar2 == (char *)0x0) {
LAB_001ae9ae:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%lf",local_98);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aea22;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aea2e;
        }
        if (local_1f8 != 0x23) break;
LAB_001aea22:
        if (pcVar2 == (char *)0x0) goto LAB_001aea33;
      }
      if (local_1f8 == 0x24) goto LAB_001aea33;
LAB_001aea2e:
      if (pcVar2 == (char *)0x0) {
LAB_001aea33:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_90);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aeaa7;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aeab3;
        }
        if (local_1f8 != 0x23) break;
LAB_001aeaa7:
        if (pcVar2 == (char *)0x0) goto LAB_001aeab8;
      }
      if (local_1f8 == 0x24) goto LAB_001aeab8;
LAB_001aeab3:
      if (pcVar2 == (char *)0x0) {
LAB_001aeab8:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_88);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aeb2c;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aeb38;
        }
        if (local_1f8 != 0x23) break;
LAB_001aeb2c:
        if (pcVar2 == (char *)0x0) goto LAB_001aeb3d;
      }
      if (local_1f8 == 0x24) goto LAB_001aeb3d;
LAB_001aeb38:
      if (pcVar2 == (char *)0x0) {
LAB_001aeb3d:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_80);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aebb1;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aebbd;
        }
        if (local_1f8 != 0x23) break;
LAB_001aebb1:
        if (pcVar2 == (char *)0x0) goto LAB_001aebc2;
      }
      if (local_1f8 == 0x24) goto LAB_001aebc2;
LAB_001aebbd:
      if (pcVar2 == (char *)0x0) {
LAB_001aebc2:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_78);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aec36;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aec42;
        }
        if (local_1f8 != 0x23) break;
LAB_001aec36:
        if (pcVar2 == (char *)0x0) goto LAB_001aec47;
      }
      if (local_1f8 == 0x24) goto LAB_001aec47;
LAB_001aec42:
      if (pcVar2 == (char *)0x0) {
LAB_001aec47:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_70);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aecbb;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aecc7;
        }
        if (local_1f8 != 0x23) break;
LAB_001aecbb:
        if (pcVar2 == (char *)0x0) goto LAB_001aeccc;
      }
      if (local_1f8 == 0x24) goto LAB_001aeccc;
LAB_001aecc7:
      if (pcVar2 == (char *)0x0) {
LAB_001aeccc:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_68);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aed40;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aed4c;
        }
        if (local_1f8 != 0x23) break;
LAB_001aed40:
        if (pcVar2 == (char *)0x0) goto LAB_001aed51;
      }
      if (local_1f8 == 0x24) goto LAB_001aed51;
LAB_001aed4c:
      if (pcVar2 == (char *)0x0) {
LAB_001aed51:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_60);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aedc5;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aedd1;
        }
        if (local_1f8 != 0x23) break;
LAB_001aedc5:
        if (pcVar2 == (char *)0x0) goto LAB_001aedd6;
      }
      if (local_1f8 == 0x24) goto LAB_001aedd6;
LAB_001aedd1:
      if (pcVar2 == (char *)0x0) {
LAB_001aedd6:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_58);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aee4a;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aee56;
        }
        if (local_1f8 != 0x23) break;
LAB_001aee4a:
        if (pcVar2 == (char *)0x0) goto LAB_001aee5b;
      }
      if (local_1f8 == 0x24) goto LAB_001aee5b;
LAB_001aee56:
      if (pcVar2 == (char *)0x0) {
LAB_001aee5b:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_50);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aeecf;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aeedb;
        }
        if (local_1f8 != 0x23) break;
LAB_001aeecf:
        if (pcVar2 == (char *)0x0) goto LAB_001aeee0;
      }
      if (local_1f8 == 0x24) goto LAB_001aeee0;
LAB_001aeedb:
      if (pcVar2 == (char *)0x0) {
LAB_001aeee0:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_48);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aef54;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aef60;
        }
        if (local_1f8 != 0x23) break;
LAB_001aef54:
        if (pcVar2 == (char *)0x0) goto LAB_001aef65;
      }
      if (local_1f8 == 0x24) goto LAB_001aef65;
LAB_001aef60:
      if (pcVar2 == (char *)0x0) {
LAB_001aef65:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_40);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar2 = fgets((char *)&local_1f8,0x100,__stream), 0x24 < local_1f8) {
          if (local_1f8 == 0x25) goto LAB_001aefd9;
          if (((local_1f8 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_1f7 != '/'))
          goto LAB_001aefe5;
        }
        if (local_1f8 != 0x23) break;
LAB_001aefd9:
        if (pcVar2 == (char *)0x0) goto LAB_001aefea;
      }
      if (local_1f8 == 0x24) goto LAB_001aefea;
LAB_001aefe5:
      if (pcVar2 == (char *)0x0) {
LAB_001aefea:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_38);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_001af03a;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_001af03a:
  if (pPathfinderDVL->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pPathfinderDVL->threadperiod = 100;
  }
  if (pPathfinderDVL->BreakDuration < 0) {
    puts("Invalid parameter : BreakDuration.");
    pPathfinderDVL->BreakDuration = 300;
  }
  if (2 < (uint)pPathfinderDVL->Parameters) {
    puts("Invalid parameter : Parameters.");
    pPathfinderDVL->Parameters = 1;
  }
  if (0xd < (uint)pPathfinderDVL->DataStream) {
    puts("Invalid parameter : DataStream.");
    pPathfinderDVL->DataStream = 6;
  }
  local_208.tv_sec = (__time_t)(pPathfinderDVL->StartupDelay / 1000);
  local_208.tv_nsec = (long)((pPathfinderDVL->StartupDelay % 1000) * 1000000);
  nanosleep(&local_208,(timespec *)0x0);
  iVar1 = OpenRS232Port(&pPathfinderDVL->RS232Port,pPathfinderDVL->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a PathfinderDVL.");
    return 1;
  }
  iVar1 = (pPathfinderDVL->RS232Port).DevType;
  if (3 < iVar1 - 1U) {
    if ((iVar1 != 0) ||
       (iVar1 = SetOptionsComputerRS232Port
                          ((pPathfinderDVL->RS232Port).hDev,pPathfinderDVL->BaudRate,'\0',0,'\b',
                           '\0',pPathfinderDVL->timeout), iVar1 != 0)) {
      pcVar2 = "Unable to connect to a PathfinderDVL.";
      goto LAB_001af3b9;
    }
    tcflush(*(int *)&(pPathfinderDVL->RS232Port).hDev,2);
  }
  local_208.tv_sec = 0;
  local_208.tv_nsec = 100000000;
  nanosleep(&local_208,(timespec *)0x0);
  if (pPathfinderDVL->bSendBreak != 0) {
    iVar1 = SendBreakPathfinderDVL
                      (pPathfinderDVL,pPathfinderDVL->BreakMode,pPathfinderDVL->BreakDuration);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : break failed.";
      goto LAB_001af3b9;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 500000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bRetrieveParameters != 0) {
    iVar1 = RetrieveParametersPathfinderDVL(pPathfinderDVL,pPathfinderDVL->Parameters);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CR command failed.";
      goto LAB_001af3b9;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bSetHeadingAlignment != 0) {
    iVar1 = SetHeadingAlignmentPathfinderDVL(pPathfinderDVL,pPathfinderDVL->HeadingAlignment);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : EA command failed.";
      goto LAB_001af3b9;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bSetRollPitchMisalignment != 0) {
    iVar1 = SetRollPitchMisalignmentPathfinderDVL
                      (pPathfinderDVL,pPathfinderDVL->RollMisalignment,
                       pPathfinderDVL->PitchMisalignment);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : #EI or #EJ commands failed.";
      goto LAB_001af3b9;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bUpOrientation != 0) {
    iVar1 = SetUpDownOrientationPathfinderDVL(pPathfinderDVL,pPathfinderDVL->bUpOrientation);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : EU command failed.";
      goto LAB_001af3b9;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bSelectDataStream != 0) {
    iVar1 = SelectDataStreamPathfinderDVL(pPathfinderDVL,pPathfinderDVL->DataStream);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : PD command failed.";
      goto LAB_001af3b9;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bEnableAutoPing != 0) {
    iVar1 = SetTurnkeyPathfinderDVL(pPathfinderDVL,pPathfinderDVL->bEnableAutoPing);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CT command failed.";
      goto LAB_001af3b9;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bKeepAsUserDefaults != 0) {
    iVar1 = KeepAsUserDefaultsPathfinderDVL(pPathfinderDVL);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CK command failed.";
      goto LAB_001af3b9;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bStartPinging != 0) {
    iVar1 = StartPingingPathfinderDVL(pPathfinderDVL);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CS command failed.";
LAB_001af3b9:
      puts(pcVar2);
      CloseRS232Port(&pPathfinderDVL->RS232Port);
      return 1;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  puts("PathfinderDVL connected.");
  return 0;
}

Assistant:

inline int ConnectPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pPathfinderDVL->szCfgFilePath, 0, sizeof(pPathfinderDVL->szCfgFilePath));
	sprintf(pPathfinderDVL->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pPathfinderDVL->szDevPath, 0, sizeof(pPathfinderDVL->szDevPath));
		sprintf(pPathfinderDVL->szDevPath, "COM1");
		pPathfinderDVL->BaudRate = 115200;
		pPathfinderDVL->timeout = 1500;
		pPathfinderDVL->threadperiod = 100;
		pPathfinderDVL->bSaveRawData = 1;
		pPathfinderDVL->StartupDelay = 4000;
		pPathfinderDVL->bSendBreak = 1;
		pPathfinderDVL->BreakMode = 1;
		pPathfinderDVL->BreakDuration = 300;
		pPathfinderDVL->bRetrieveParameters = 1;
		pPathfinderDVL->Parameters = 1;
		pPathfinderDVL->bSetHeadingAlignment = 1;
		pPathfinderDVL->HeadingAlignment = 45;
		pPathfinderDVL->bSetRollPitchMisalignment = 0;
		pPathfinderDVL->RollMisalignment = 0;
		pPathfinderDVL->PitchMisalignment = 0;
		pPathfinderDVL->bUpOrientation = 0;
		pPathfinderDVL->bSelectDataStream = 1;
		pPathfinderDVL->DataStream = 6;
		pPathfinderDVL->bEnableAutoPing = 0;
		pPathfinderDVL->bKeepAsUserDefaults = 1;
		pPathfinderDVL->bStartPinging = 1;
		pPathfinderDVL->bEnable_PD6_SA = 0;
		pPathfinderDVL->bEnable_PD6_TS = 0;
		pPathfinderDVL->bEnable_PD6_BI = 0;
		pPathfinderDVL->bEnable_PD6_BS = 1;
		pPathfinderDVL->bEnable_PD6_BE = 0;
		pPathfinderDVL->bEnable_PD6_BD = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pPathfinderDVL->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->StartupDelay) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSendBreak) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->BreakMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->BreakDuration) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bRetrieveParameters) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->Parameters) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSetHeadingAlignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pPathfinderDVL->HeadingAlignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSetRollPitchMisalignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pPathfinderDVL->RollMisalignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pPathfinderDVL->PitchMisalignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bUpOrientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSelectDataStream) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->DataStream) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnableAutoPing) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bKeepAsUserDefaults) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bStartPinging) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_SA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_TS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BI) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BE) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BD) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}
	
	if (pPathfinderDVL->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pPathfinderDVL->threadperiod = 100;
	}
	if (pPathfinderDVL->BreakDuration < 0)
	{
		printf("Invalid parameter : BreakDuration.\n");
		pPathfinderDVL->BreakDuration = 300;
	}
	if ((pPathfinderDVL->Parameters < 0)||(pPathfinderDVL->Parameters > 2))
	{
		printf("Invalid parameter : Parameters.\n");
		pPathfinderDVL->Parameters = 1;
	}
	if ((pPathfinderDVL->DataStream < 0)||(pPathfinderDVL->DataStream > 13))
	{
		printf("Invalid parameter : DataStream.\n");
		pPathfinderDVL->DataStream = 6;
	}

	// Used to save raw data, should be handled specifically...
	//pPathfinderDVL->pfSaveFile = NULL;

	//pPathfinderDVL->LastAltitude = 0;
	
	// When the DVL restarts, it might silently miss the first commands if it is not yet ready
	// (however this is unlikely to be a real problem as long as the correct parameters were saved).
	// Or maybe try to send break and retry until their is the prompt?
	mSleep(pPathfinderDVL->StartupDelay);

	if (OpenRS232Port(&pPathfinderDVL->RS232Port, pPathfinderDVL->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a PathfinderDVL.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pPathfinderDVL->RS232Port, pPathfinderDVL->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pPathfinderDVL->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a PathfinderDVL.\n");
		CloseRS232Port(&pPathfinderDVL->RS232Port);
		return EXIT_FAILURE;
	}
	
	mSleep(100);

	if (pPathfinderDVL->bSendBreak)
	{
		if (SendBreakPathfinderDVL(pPathfinderDVL, pPathfinderDVL->BreakMode, pPathfinderDVL->BreakDuration) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : break failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(500);
	}

	if (pPathfinderDVL->bRetrieveParameters)
	{
		if (RetrieveParametersPathfinderDVL(pPathfinderDVL, pPathfinderDVL->Parameters) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CR command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bSetHeadingAlignment)
	{
		if (SetHeadingAlignmentPathfinderDVL(pPathfinderDVL, pPathfinderDVL->HeadingAlignment) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : EA command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bSetRollPitchMisalignment)
	{
		if (SetRollPitchMisalignmentPathfinderDVL(pPathfinderDVL, pPathfinderDVL->RollMisalignment, pPathfinderDVL->PitchMisalignment) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : #EI or #EJ commands failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bUpOrientation)
	{
		if (SetUpDownOrientationPathfinderDVL(pPathfinderDVL, pPathfinderDVL->bUpOrientation) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : EU command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bSelectDataStream)
	{
		if (SelectDataStreamPathfinderDVL(pPathfinderDVL, pPathfinderDVL->DataStream) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : PD command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bEnableAutoPing)
	{
		if (SetTurnkeyPathfinderDVL(pPathfinderDVL, pPathfinderDVL->bEnableAutoPing) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CT command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bKeepAsUserDefaults)
	{
		if (KeepAsUserDefaultsPathfinderDVL(pPathfinderDVL) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CK command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bStartPinging)
	{
		if (StartPingingPathfinderDVL(pPathfinderDVL) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CS command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}
	
	printf("PathfinderDVL connected.\n");

	return EXIT_SUCCESS;
}